

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

matrix3d * __thiscall tinyusdz::value::matrix3d::operator=(matrix3d *this,matrix3f *src)

{
  matrix3d *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (*(double (*) [3])*(double (*) [3])this)[lVar3] =
           (double)(*(float (*) [3])*(float (*) [3])src)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    src = (matrix3f *)((long)src + 0xc);
    this = (matrix3d *)((long)this + 0x18);
  } while (lVar2 != 3);
  return pmVar1;
}

Assistant:

matrix3d &matrix3d::operator=(const matrix3f &src) {

  for (size_t j = 0; j < 3; j++) {
    for (size_t i = 0; i < 3; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}